

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall ecjacobian::mul2(ecjacobian *this)

{
  gfield *y;
  bigint<13> *pbVar1;
  gfield *pgVar2;
  gfield *pgVar3;
  long lVar4;
  ecjacobian *peVar5;
  gfield d;
  gfield c;
  gfield b;
  gfield a;
  
  if ((this->z).super_gfint.len != 0) {
    if ((this->y).super_gfint.len == 0) {
      peVar5 = &origin;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        (this->x).super_gfint.len = (peVar5->x).super_gfint.len;
        peVar5 = (ecjacobian *)(peVar5->x).super_gfint.digits;
        this = (ecjacobian *)(this->x).super_gfint.digits;
      }
    }
    else {
      pgVar3 = &this->z;
      y = &this->y;
      pbVar1 = &gfield::square<13>((gfield *)&c.super_gfint,&pgVar3->super_gfint)->super_gfint;
      gfield::sub<13,13>((gfield *)&d.super_gfint,(bigint<13> *)this,pbVar1);
      pbVar1 = &gfield::add<13>((gfield *)&c.super_gfint,(bigint<13> *)this)->super_gfint;
      gfield::mul<13>((gfield *)&d.super_gfint,pbVar1);
      pgVar2 = gfield::mul2<13>((gfield *)&c.super_gfint,&d.super_gfint);
      gfield::add<13>(pgVar2,&d.super_gfint);
      pgVar2 = gfield::mul<13>(pgVar3,&y->super_gfint);
      gfield::add<13>(pgVar2,&pgVar3->super_gfint);
      gfield::square<13>((gfield *)&a.super_gfint,&y->super_gfint);
      gfield::mul2<13>((gfield *)&b.super_gfint,&a.super_gfint);
      pgVar3 = gfield::mul2<13>((gfield *)&d.super_gfint,(bigint<13> *)this);
      gfield::mul<13>(pgVar3,&b.super_gfint);
      pgVar3 = gfield::square<13>(&this->x,&c.super_gfint);
      pgVar3 = gfield::sub<13>(pgVar3,&d.super_gfint);
      gfield::sub<13>(pgVar3,&d.super_gfint);
      pgVar3 = gfield::square<13>((gfield *)&a.super_gfint,&b.super_gfint);
      gfield::add<13>(pgVar3,&a.super_gfint);
      pgVar3 = gfield::sub<13,13>(y,&d.super_gfint,(bigint<13> *)this);
      pgVar3 = gfield::mul<13>(pgVar3,&c.super_gfint);
      gfield::sub<13>(pgVar3,&a.super_gfint);
    }
  }
  return;
}

Assistant:

bool iszero() const { return !len; }